

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O1

int mbedtls_xtea_crypt_ecb(mbedtls_xtea_context *ctx,int mode,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = *(uint *)input;
  uVar2 = *(uint *)(input + 4);
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (mode == 1) {
    uVar2 = 0;
    iVar4 = 0x20;
    do {
      uVar3 = uVar3 + (ctx->k[uVar2 & 3] + uVar2 ^ (uVar1 >> 5 ^ uVar1 << 4) + uVar1);
      uVar2 = uVar2 + 0x9e3779b9;
      uVar1 = uVar1 + (*(int *)((long)ctx->k + (ulong)(uVar2 >> 9 & 0xc)) + uVar2 ^
                      (uVar3 >> 5 ^ uVar3 * 0x10) + uVar3);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  else {
    uVar2 = 0xc6ef3720;
    iVar4 = 0x20;
    do {
      uVar1 = uVar1 - (*(int *)((long)ctx->k + (ulong)(uVar2 >> 9 & 0xc)) + uVar2 ^
                      (uVar3 >> 5 ^ uVar3 << 4) + uVar3);
      uVar2 = uVar2 + 0x61c88647;
      uVar3 = uVar3 - (ctx->k[uVar2 & 3] + uVar2 ^ (uVar1 >> 5 ^ uVar1 * 0x10) + uVar1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  *output = (uchar)(uVar3 >> 0x18);
  output[1] = (uchar)(uVar3 >> 0x10);
  output[2] = (uchar)(uVar3 >> 8);
  output[3] = (uchar)uVar3;
  output[4] = (uchar)(uVar1 >> 0x18);
  output[5] = (uchar)(uVar1 >> 0x10);
  output[6] = (uchar)(uVar1 >> 8);
  output[7] = (uchar)uVar1;
  return 0;
}

Assistant:

int mbedtls_xtea_crypt_ecb( mbedtls_xtea_context *ctx, int mode,
                    const unsigned char input[8], unsigned char output[8])
{
    uint32_t *k, v0, v1, i;

    k = ctx->k;

    GET_UINT32_BE( v0, input, 0 );
    GET_UINT32_BE( v1, input, 4 );

    if( mode == MBEDTLS_XTEA_ENCRYPT )
    {
        uint32_t sum = 0, delta = 0x9E3779B9;

        for( i = 0; i < 32; i++ )
        {
            v0 += (((v1 << 4) ^ (v1 >> 5)) + v1) ^ (sum + k[sum & 3]);
            sum += delta;
            v1 += (((v0 << 4) ^ (v0 >> 5)) + v0) ^ (sum + k[(sum>>11) & 3]);
        }
    }
    else /* MBEDTLS_XTEA_DECRYPT */
    {
        uint32_t delta = 0x9E3779B9, sum = delta * 32;

        for( i = 0; i < 32; i++ )
        {
            v1 -= (((v0 << 4) ^ (v0 >> 5)) + v0) ^ (sum + k[(sum>>11) & 3]);
            sum -= delta;
            v0 -= (((v1 << 4) ^ (v1 >> 5)) + v1) ^ (sum + k[sum & 3]);
        }
    }

    PUT_UINT32_BE( v0, output, 0 );
    PUT_UINT32_BE( v1, output, 4 );

    return( 0 );
}